

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O2

CcsContext __thiscall ccs::CcsDomain::build(CcsDomain *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  CcsContext CVar1;
  __shared_ptr<ccs::Node_const,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<ccs::Node_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<ccs::Node,void>
            (local_20,(__shared_ptr<ccs::Node,_(__gnu_cxx::_Lock_policy)2> *)(*in_RSI + 8));
  CcsContext::CcsContext((CcsContext *)this,(shared_ptr<const_ccs::Node> *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  CVar1.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  CVar1.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CcsContext)
         CVar1.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CcsContext CcsDomain::build() {
  return CcsContext(dag->root());
}